

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O2

bool __thiscall Calculator::execute(Calculator *this,string *line,bool printResult)

{
  int iVar1;
  double dVar2;
  ResultValue value;
  ResultValue value_00;
  bool bVar3;
  ResultValueType RVar4;
  long lVar5;
  int64_t iVar6;
  size_type sVar7;
  mapped_type *this_00;
  ostream *poVar8;
  string *this_01;
  size_type sVar9;
  allocator local_171;
  string local_170;
  string cmd;
  undefined8 local_130;
  string baseSubscript;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  value_type local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (line->_M_string_length < 2) {
    if (line->_M_string_length == 0) {
      return false;
    }
  }
  else if (*(line->_M_dataplus)._M_p == ':') {
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)line);
    std::__cxx11::string::string((string *)&baseSubscript," ",&local_171);
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
    cmd._M_string_length = 0;
    cmd.field_2._M_local_buf[0] = '\0';
    while (lVar5 = std::__cxx11::string::find((string *)&local_d0,(ulong)&baseSubscript),
          lVar5 != -1) {
      std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_d0);
      std::__cxx11::string::operator=((string *)&cmd,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&parts,&cmd);
      std::__cxx11::string::erase((ulong)&local_d0,0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&parts,&local_d0);
    std::__cxx11::string::~string((string *)&cmd);
    std::__cxx11::string::~string((string *)&baseSubscript);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string
              ((string *)&cmd,
               (string *)
               parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    sVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count(&(this->mCommands)._M_h,&cmd);
    if (sVar7 == 0) {
      poVar8 = this->mOutputStream;
      std::operator+(&baseSubscript,"There exists no command called \'",&cmd);
      std::operator+(&local_170,&baseSubscript,"\'. Type \':help\' for a list of commands.");
      poVar8 = std::operator<<(poVar8,(string *)&local_170);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&baseSubscript);
      bVar3 = false;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&parts,(const_iterator)
                     parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->mCommands,&cmd);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e8,&parts);
      bVar3 = std::
              function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              ::operator()(this_00,&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
    }
    std::__cxx11::string::~string((string *)&cmd);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&parts);
    return bVar3;
  }
  CalculationEngine::evaluate((ResultValue *)&cmd,&this->mEngine,line,&this->mEnvironment);
  RVar4 = ResultValue::type((ResultValue *)&cmd);
  if (!printResult || RVar4 == NONE) {
    return false;
  }
  RVar4 = ResultValue::type((ResultValue *)&cmd);
  if (RVar4 == INTEGER) {
    iVar1 = this->mPrintNumBase;
    if (iVar1 == 2) {
      poVar8 = this->mOutputStream;
      iVar6 = ResultValue::intValue((ResultValue *)&cmd);
      std::__cxx11::string::string((string *)&local_50,"0b",(allocator *)&baseSubscript);
      NumberHelpers::toBase(&local_170,iVar6,2,&local_50);
      poVar8 = std::operator<<(poVar8,(string *)&local_170);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_170);
      this_01 = &local_50;
    }
    else {
      if (iVar1 == 10) {
        poVar8 = this->mOutputStream;
        ResultValue::intValue((ResultValue *)&cmd);
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        goto LAB_0012a5fe;
      }
      if (iVar1 == 0x10) {
        poVar8 = this->mOutputStream;
        iVar6 = ResultValue::intValue((ResultValue *)&cmd);
        std::__cxx11::string::string((string *)&local_70,"0x",(allocator *)&baseSubscript);
        NumberHelpers::toBase(&local_170,iVar6,0x10,&local_70);
        poVar8 = std::operator<<(poVar8,(string *)&local_170);
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&local_170);
        this_01 = &local_70;
      }
      else {
        std::__cxx11::to_string(&local_170,iVar1);
        std::operator+(&baseSubscript,"_",&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::to_string(&local_170,(long)this->mPrintNumBase);
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        for (sVar9 = 0; local_170._M_string_length != sVar9; sVar9 = sVar9 + 1) {
          std::__cxx11::string::append((string *)&parts);
        }
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::operator=((string *)&baseSubscript,(string *)&parts);
        std::__cxx11::string::~string((string *)&parts);
        poVar8 = this->mOutputStream;
        iVar6 = ResultValue::intValue((ResultValue *)&cmd);
        iVar1 = this->mPrintNumBase;
        std::__cxx11::string::string((string *)&local_90,"",(allocator *)&parts);
        NumberHelpers::toBase(&local_170,iVar6,iVar1,&local_90);
        poVar8 = std::operator<<(poVar8,(string *)&local_170);
        poVar8 = std::operator<<(poVar8,(string *)&baseSubscript);
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_90);
        this_01 = &baseSubscript;
      }
    }
    std::__cxx11::string::~string((string *)this_01);
  }
  else {
    RVar4 = ResultValue::type((ResultValue *)&cmd);
    if ((RVar4 == COMPLEX) && (this->mPrintInPolar == true)) {
      ResultValue::complexValue((ResultValue *)&cmd);
      dVar2 = std::abs<double>((complex<double> *)&local_170);
      poVar8 = std::ostream::_M_insert<double>(dVar2);
      std::operator<<(poVar8," * e^(");
      ResultValue::complexValue((ResultValue *)&cmd);
      dVar2 = std::arg<double>((complex<double> *)&baseSubscript);
      poVar8 = std::ostream::_M_insert<double>(dVar2);
      poVar8 = std::operator<<(poVar8,"i)");
      std::endl<char,std::char_traits<char>>(poVar8);
      goto LAB_0012a7dd;
    }
    value.mFloatValue._1_7_ = cmd.field_2._M_allocated_capacity._1_7_;
    value.mFloatValue._0_1_ = cmd.field_2._M_local_buf[0];
    value.mIntValue = cmd._M_string_length;
    value._0_8_ = cmd._M_dataplus._M_p;
    value.mComplexValue._M_value._0_8_ = cmd.field_2._8_8_;
    value.mComplexValue._M_value._8_8_ = local_130;
    poVar8 = operator<<(this->mOutputStream,value);
LAB_0012a5fe:
    std::endl<char,std::char_traits<char>>(poVar8);
  }
LAB_0012a7dd:
  std::__cxx11::string::string((string *)&local_b0,"ans",(allocator *)&local_170);
  value_00.mFloatValue._1_7_ = cmd.field_2._M_allocated_capacity._1_7_;
  value_00.mFloatValue._0_1_ = cmd.field_2._M_local_buf[0];
  value_00.mIntValue = cmd._M_string_length;
  value_00._0_8_ = cmd._M_dataplus._M_p;
  value_00.mComplexValue._M_value._0_8_ = cmd.field_2._8_8_;
  value_00.mComplexValue._M_value._8_8_ = local_130;
  Environment::set(&this->mEnvironment,&local_b0,value_00);
  std::__cxx11::string::~string((string *)&local_b0);
  return false;
}

Assistant:

bool Calculator::execute(const std::string& line, bool printResult) {
	if (line.size() > 1 && line[0] == ':') {
		auto parts = splitString(line.substr(1), " ");
		std::string cmd = parts[0];

		if (mCommands.count(cmd) > 0) {
			parts.erase(parts.begin());
			return mCommands[cmd](parts);
		} else {
			mOutputStream << "There exists no command called '" + cmd + "'. Type ':help' for a list of commands." << std::endl;
		}

		return false;
	}

	if (line.empty()) {
		return false;
	}

	try {
		auto res = mEngine.evaluate(line, mEnvironment);

		if (res.type() != ResultValueType::NONE) {
			if (printResult) {
				if (res.type() == ResultValueType::INTEGER) {
					switch (mPrintNumBase) {
						case 2:
							mOutputStream << NumberHelpers::toBase(res.intValue(), 2, "0b") << std::endl;
							break;
						case 10:
							mOutputStream << res.intValue() << std::endl;
							break;
						case 16:
							mOutputStream << NumberHelpers::toBase(res.intValue(), 16, "0x") << std::endl;
							break;
						default:
							std::string baseSubscript = "_" + std::to_string(mPrintNumBase);

							#ifdef __unix__
							baseSubscript = getSubscript(mPrintNumBase);
							#endif

							mOutputStream << NumberHelpers::toBase(res.intValue(), mPrintNumBase) << baseSubscript << std::endl;
							break;
					}
				} else if (res.type() == ResultValueType::COMPLEX && mPrintInPolar) {
					mOutputStream << std::abs(res.complexValue()) << " * e^(" << std::arg(res.complexValue()) << "i)" << std::endl;
				} else {
					mOutputStream << res << std::endl;
				}

				mEnvironment.set("ans", res);
			}
		}
	} catch (std::exception& e) {
		mOutputStream << "Error: " << e.what() << std::endl;
	}

	return false;
}